

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontend.cpp
# Opt level: O1

void __thiscall
llbuild::buildsystem::BuildSystemFrontend::~BuildSystemFrontend(BuildSystemFrontend *this)

{
  void *pvVar1;
  
  pvVar1 = this->impl;
  if (pvVar1 != (void *)0x0) {
    std::
    unique_ptr<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
    ::~unique_ptr((unique_ptr<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
                   *)((long)pvVar1 + 0x20));
    if (*(long **)((long)pvVar1 + 0x18) != (long *)0x0) {
      (**(code **)(**(long **)((long)pvVar1 + 0x18) + 8))();
    }
    *(undefined8 *)((long)pvVar1 + 0x18) = 0;
    operator_delete(pvVar1,0x58);
  }
  this->impl = (void *)0x0;
  return;
}

Assistant:

BuildSystemFrontend::~BuildSystemFrontend() {
  delete static_cast<BuildSystemFrontendImpl*>(impl);
  impl = nullptr;
}